

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O2

string_view __thiscall
Jupiter::GenericCommandNamespace::getHelp(GenericCommandNamespace *this,string_view parameters)

{
  int iVar1;
  GenericCommand *pGVar2;
  undefined4 extraout_var;
  char *extraout_RDX;
  char *pcVar4;
  string_view sVar5;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  input_split;
  string_view parameters_local;
  size_type sVar3;
  
  parameters_local._M_str = parameters._M_str;
  parameters_local._M_len = parameters._M_len;
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&input_split,&parameters_local,&GENERIC_COMMAND_WORD_DELIMITER_SV);
  if (input_split.second._M_len == 0) {
    if (this->m_should_update_help == true) {
      updateHelp(this);
    }
    pcVar4 = (this->m_help)._M_dataplus._M_p;
    sVar3 = (this->m_help)._M_string_length;
  }
  else {
    pGVar2 = getCommand(this,input_split.first);
    if (pGVar2 == (GenericCommand *)0x0) {
      pcVar4 = "Error: Command not found";
      sVar3 = 0x18;
    }
    else {
      iVar1 = (**(pGVar2->super_Command)._vptr_Command)
                        (pGVar2,input_split.second._M_len,input_split.second._M_str);
      sVar3 = CONCAT44(extraout_var,iVar1);
      pcVar4 = extraout_RDX;
    }
  }
  sVar5._M_str = pcVar4;
  sVar5._M_len = sVar3;
  return sVar5;
}

Assistant:

std::string_view Jupiter::GenericCommandNamespace::getHelp(std::string_view parameters) {
	auto input_split = jessilib::word_split_once_view(parameters, GENERIC_COMMAND_WORD_DELIMITER_SV);
	if (input_split.second.empty()) // No parameters; list commands
	{
		if (Jupiter::GenericCommandNamespace::m_should_update_help)
			Jupiter::GenericCommandNamespace::updateHelp();

		return Jupiter::GenericCommandNamespace::m_help;
	}

	GenericCommand *command;

	// Search for command
	command = Jupiter::GenericCommandNamespace::getCommand(input_split.first);
	if (command != nullptr) {
		return command->getHelp(input_split.second);
	}

	// Command not found
	return "Error: Command not found"sv;
}